

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_fe_non_zero(secp256k1_fe *nz)

{
  int iVar1;
  secp256k1_fe *in_RDI;
  secp256k1_fe *unaff_retaddr;
  int tries;
  int local_c;
  
  local_c = 10;
  do {
    local_c = local_c + -1;
    if (local_c < 0) break;
    random_fe(unaff_retaddr);
    secp256k1_fe_impl_normalize(in_RDI);
    iVar1 = secp256k1_fe_impl_is_zero(in_RDI);
  } while (iVar1 != 0);
  if (-1 < local_c) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0xbc7,"test condition failed: tries >= 0");
  abort();
}

Assistant:

static void random_fe_non_zero(secp256k1_fe *nz) {
    int tries = 10;
    while (--tries >= 0) {
        random_fe(nz);
        secp256k1_fe_normalize(nz);
        if (!secp256k1_fe_is_zero(nz)) {
            break;
        }
    }
    /* Infinitesimal probability of spurious failure here */
    CHECK(tries >= 0);
}